

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineOffsetCache.cpp
# Opt level: O0

void __thiscall
Js::LineOffsetCache::AddLine
          (LineOffsetCache *this,Recycler *allocator,charcount_t characterOffset,
          charcount_t byteOffset)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> **ppRVar5;
  Recycler *pRVar6;
  List<unsigned_int,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer> *this_00;
  ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *pRVar7;
  undefined4 *puVar8;
  ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *pRVar9;
  uint *puVar10;
  charcount_t previousByteOffset;
  charcount_t previousCharacterOffset;
  TrackAllocData local_58;
  List<unsigned_int,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer> *local_30;
  LineOffsetCacheList *byteOffsetList;
  LineOffsetCacheList *characterOffsetList;
  charcount_t byteOffset_local;
  charcount_t characterOffset_local;
  Recycler *allocator_local;
  LineOffsetCache *this_local;
  
  characterOffsetList._0_4_ = byteOffset;
  characterOffsetList._4_4_ = characterOffset;
  _byteOffset_local = allocator;
  allocator_local = (Recycler *)this;
  ppRVar5 = Memory::WriteBarrierPtr::operator_cast_to_ReadOnlyList__((WriteBarrierPtr *)this);
  byteOffsetList = (LineOffsetCacheList *)*ppRVar5;
  ppRVar5 = Memory::WriteBarrierPtr::operator_cast_to_ReadOnlyList__
                      ((WriteBarrierPtr *)&this->lineByteOffsetCacheList);
  pRVar6 = _byteOffset_local;
  local_30 = (List<unsigned_int,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer> *)
             *ppRVar5;
  if ((characterOffsetList._4_4_ != (charcount_t)characterOffsetList) &&
     (local_30 ==
      (List<unsigned_int,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer> *)0x0)) {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_58,
               (type_info *)
               &JsUtil::
                List<unsigned_int,Memory::Recycler,true,Js::CopyRemovePolicy,DefaultComparer>::
                typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/LineOffsetCache.cpp"
               ,0xdf);
    pRVar6 = Memory::Recycler::TrackAllocInfo(pRVar6,&local_58);
    this_00 = (List<unsigned_int,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer> *)
              new<Memory::Recycler>(0x30,pRVar6,0x43c4b0);
    JsUtil::List<unsigned_int,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>::List
              (this_00,_byteOffset_local,4);
    local_30 = this_00;
    JsUtil::List<unsigned_int,Memory::Recycler,true,Js::CopyRemovePolicy,DefaultComparer>::
    Copy<JsUtil::List<unsigned_int,Memory::Recycler,true,Js::CopyRemovePolicy,DefaultComparer>>
              ((List<unsigned_int,Memory::Recycler,true,Js::CopyRemovePolicy,DefaultComparer> *)
               this_00,byteOffsetList);
    Memory::WriteBarrierPtr<JsUtil::ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>_>
    ::operator=(&this->lineByteOffsetCacheList,
                &local_30->super_ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>);
  }
  if (local_30 !=
      (List<unsigned_int,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer> *)0x0) {
    JsUtil::List<unsigned_int,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>::Add
              (local_30,(uint *)&characterOffsetList);
  }
  JsUtil::List<unsigned_int,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>::Add
            (byteOffsetList,(uint *)((long)&characterOffsetList + 4));
  ppRVar5 = Memory::WriteBarrierPtr::operator_cast_to_ReadOnlyList__
                      ((WriteBarrierPtr *)&this->lineByteOffsetCacheList);
  if (*ppRVar5 != (ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *)0x0) {
    pRVar7 = Memory::
             WriteBarrierPtr<JsUtil::ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>_>
             ::operator->(&this->lineByteOffsetCacheList);
    iVar3 = JsUtil::ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>::Count(pRVar7);
    pRVar7 = Memory::
             WriteBarrierPtr<JsUtil::ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>_>
             ::operator->(&this->lineCharacterOffsetCacheList);
    iVar4 = JsUtil::ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>::Count(pRVar7);
    if (iVar3 != iVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/LineOffsetCache.cpp"
                                  ,0xea,
                                  "(this->lineByteOffsetCacheList == nullptr || this->lineByteOffsetCacheList->Count() == this->lineCharacterOffsetCacheList->Count())"
                                  ,
                                  "this->lineByteOffsetCacheList == nullptr || this->lineByteOffsetCacheList->Count() == this->lineCharacterOffsetCacheList->Count()"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
  }
  pRVar7 = Memory::
           WriteBarrierPtr<JsUtil::ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>_>::
           operator->(&this->lineCharacterOffsetCacheList);
  iVar3 = JsUtil::ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>::Count(pRVar7);
  if (1 < iVar3) {
    pRVar7 = Memory::
             WriteBarrierPtr<JsUtil::ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>_>
             ::operator->(&this->lineCharacterOffsetCacheList);
    pRVar9 = Memory::
             WriteBarrierPtr<JsUtil::ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>_>
             ::operator->(&this->lineCharacterOffsetCacheList);
    iVar3 = JsUtil::ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>::Count(pRVar9);
    puVar10 = JsUtil::ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>::Item
                        (pRVar7,iVar3 + -2);
    if (characterOffsetList._4_4_ <= *puVar10) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/LineOffsetCache.cpp"
                                  ,0xef,"(characterOffset > previousCharacterOffset)",
                                  "The character offsets must be inserted in increasing order per line."
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    ppRVar5 = Memory::WriteBarrierPtr::operator_cast_to_ReadOnlyList__
                        ((WriteBarrierPtr *)&this->lineByteOffsetCacheList);
    if (*ppRVar5 != (ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *)0x0) {
      pRVar7 = Memory::
               WriteBarrierPtr<JsUtil::ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>_>
               ::operator->(&this->lineByteOffsetCacheList);
      pRVar9 = Memory::
               WriteBarrierPtr<JsUtil::ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>_>
               ::operator->(&this->lineByteOffsetCacheList);
      iVar3 = JsUtil::ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>::Count(pRVar9);
      puVar10 = JsUtil::ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>::Item
                          (pRVar7,iVar3 + -2);
      if ((charcount_t)characterOffsetList <= *puVar10) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/LineOffsetCache.cpp"
                                    ,0xf3,"(byteOffset > previousByteOffset)",
                                    "The byte offsets must be inserted in increasing order per line."
                                   );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
    }
  }
  return;
}

Assistant:

void LineOffsetCache::AddLine(Recycler * allocator, charcount_t characterOffset, charcount_t byteOffset)
    {
        LineOffsetCacheList * characterOffsetList = (LineOffsetCacheList *)(LineOffsetCacheReadOnlyList*)this->lineCharacterOffsetCacheList;
        LineOffsetCacheList * byteOffsetList = (LineOffsetCacheList *)(LineOffsetCacheReadOnlyList*)this->lineByteOffsetCacheList;
        if (characterOffset != byteOffset && byteOffsetList == nullptr)
        {
                byteOffsetList = RecyclerNew(allocator, LineOffsetCacheList, allocator);
                byteOffsetList->Copy(characterOffsetList);
                this->lineByteOffsetCacheList = byteOffsetList;
        }
        if (byteOffsetList != nullptr)
        {
            byteOffsetList->Add(byteOffset);
        }
        characterOffsetList->Add(characterOffset);

#if DBG
        Assert(this->lineByteOffsetCacheList == nullptr || this->lineByteOffsetCacheList->Count() == this->lineCharacterOffsetCacheList->Count());
        if (this->lineCharacterOffsetCacheList->Count() > 1)
        {
            // Ensure that the list remains sorted during insertion.
            charcount_t previousCharacterOffset = this->lineCharacterOffsetCacheList->Item(this->lineCharacterOffsetCacheList->Count() - 2);
            AssertMsg(characterOffset > previousCharacterOffset, "The character offsets must be inserted in increasing order per line.");
            if (this->lineByteOffsetCacheList != nullptr)
            {
                charcount_t previousByteOffset = this->lineByteOffsetCacheList->Item(this->lineByteOffsetCacheList->Count() - 2);
                AssertMsg(byteOffset > previousByteOffset, "The byte offsets must be inserted in increasing order per line.");
            }
        }
#endif // DBG
    }